

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

DdNode * Cudd_Support(DdManager *dd,DdNode *f)

{
  int *support_00;
  ulong uVar1;
  DdNode *g;
  DdNode *pDVar2;
  int local_54;
  int local_50;
  int local_48;
  int size;
  int j;
  int i;
  DdNode *var;
  DdNode *tmp;
  DdNode *res;
  int *support;
  DdNode *f_local;
  DdManager *dd_local;
  
  if (dd->size < dd->sizeZ) {
    local_50 = dd->sizeZ;
  }
  else {
    local_50 = dd->size;
  }
  support_00 = (int *)malloc((long)local_50 << 2);
  if (support_00 == (int *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
    dd_local = (DdManager *)0x0;
  }
  else {
    for (size = 0; size < local_50; size = size + 1) {
      support_00[size] = 0;
    }
    ddSupportStep((DdNode *)((ulong)f & 0xfffffffffffffffe),support_00);
    ddClearFlag((DdNode *)((ulong)f & 0xfffffffffffffffe));
    do {
      dd->reordered = 0;
      tmp = dd->one;
      uVar1 = (ulong)tmp & 0xfffffffffffffffe;
      *(int *)(uVar1 + 4) = *(int *)(uVar1 + 4) + 1;
      local_48 = local_50;
      while (local_48 = local_48 + -1, -1 < local_48) {
        if (local_48 < dd->size) {
          local_54 = dd->invperm[local_48];
        }
        else {
          local_54 = local_48;
        }
        if (support_00[local_54] == 1) {
          g = cuddUniqueInter(dd,local_54,dd->one,(DdNode *)((ulong)dd->one ^ 1));
          *(int *)(((ulong)g & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)g & 0xfffffffffffffffe) + 4) + 1;
          pDVar2 = cuddBddAndRecur(dd,tmp,g);
          if (pDVar2 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,tmp);
            Cudd_RecursiveDeref(dd,g);
            tmp = (DdNode *)0x0;
            break;
          }
          *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
          Cudd_RecursiveDeref(dd,tmp);
          Cudd_RecursiveDeref(dd,g);
          tmp = pDVar2;
        }
      }
    } while (dd->reordered == 1);
    if (support_00 != (int *)0x0) {
      free(support_00);
    }
    if (tmp != (DdNode *)0x0) {
      *(int *)(((ulong)tmp & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)tmp & 0xfffffffffffffffe) + 4) + -1;
    }
    dd_local = (DdManager *)tmp;
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
Cudd_Support(
  DdManager * dd /* manager */,
  DdNode * f /* DD whose support is sought */)
{
    int *support;
    DdNode *res, *tmp, *var;
    int i,j;
    int size;

    /* Allocate and initialize support array for ddSupportStep. */
    size = ddMax(dd->size, dd->sizeZ);
    support = ABC_ALLOC(int,size);
    if (support == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    for (i = 0; i < size; i++) {
        support[i] = 0;
    }

    /* Compute support and clean up markers. */
    ddSupportStep(Cudd_Regular(f),support);
    ddClearFlag(Cudd_Regular(f));

    /* Transform support from array to cube. */
    do {
        dd->reordered = 0;
        res = DD_ONE(dd);
        cuddRef(res);
        for (j = size - 1; j >= 0; j--) { /* for each level bottom-up */
            i = (j >= dd->size) ? j : dd->invperm[j];
            if (support[i] == 1) {
                /* The following call to cuddUniqueInter is guaranteed
                ** not to trigger reordering because the node we look up
                ** already exists. */
                var = cuddUniqueInter(dd,i,dd->one,Cudd_Not(dd->one));
                cuddRef(var);
                tmp = cuddBddAndRecur(dd,res,var);
                if (tmp == NULL) {
                    Cudd_RecursiveDeref(dd,res);
                    Cudd_RecursiveDeref(dd,var);
                    res = NULL;
                    break;
                }
                cuddRef(tmp);
                Cudd_RecursiveDeref(dd,res);
                Cudd_RecursiveDeref(dd,var);
                res = tmp;
            }
        }
    } while (dd->reordered == 1);

    ABC_FREE(support);
    if (res != NULL) cuddDeref(res);
    return(res);

}